

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O3

int __thiscall smf::Binasc::processDecimalWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  byte bVar1;
  pointer pcVar2;
  ushort value;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ostream *poVar7;
  long lVar8;
  char *pcVar9;
  ulong value_00;
  char cVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  char cVar14;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  double value_01;
  char local_3a [4];
  char local_36;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  uVar4 = (uint)word->_M_string_length;
  if (0 < (int)uVar4) {
    pcVar2 = (word->_M_dataplus)._M_p;
    iVar11 = -1;
    uVar16 = 0;
    uVar6 = 0xffffffff;
    iVar13 = -1;
    iVar5 = -1;
    iVar12 = -1;
    do {
      bVar1 = pcVar2[uVar16];
      iVar3 = (int)uVar6;
      iVar15 = (int)uVar16;
      switch(bVar1) {
      case 0x27:
        if (iVar3 != -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar9 = "extra quote in decimal number";
          lVar8 = 0x1d;
          goto LAB_00128d90;
        }
        uVar6 = uVar16 & 0xffffffff;
        break;
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2b:
      case 0x2c:
      case 0x2f:
switchD_00128bc0_caseD_28:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error on line ",0xe);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Invalid character in decimal number (character number ",
                   0x36);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
        cVar10 = (char)poVar7;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + cVar10);
        goto LAB_00128db2;
      case 0x2d:
        if (iVar13 != -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar9 = "cannot have more than two minus signs in number";
          lVar8 = 0x2f;
          goto LAB_00128d90;
        }
        if ((uVar16 == 0) || (iVar13 = iVar15, pcVar2[uVar16 - 1] != '\'')) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar9 = "minus sign must immediately follow quote mark";
          lVar8 = 0x2d;
          goto LAB_00128d90;
        }
        break;
      case 0x2e:
        if (iVar3 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar9 = "cannot have decimal marker before quote";
          lVar8 = 0x27;
          goto LAB_00128d90;
        }
        bVar17 = iVar5 != -1;
        iVar5 = iVar15;
        if (bVar17) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar9 = "extra period in decimal number";
          lVar8 = 0x1e;
          goto LAB_00128d90;
        }
        break;
      case 0x30:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x39:
        if (iVar3 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar9 = "cannot have numbers before quote in decimal number";
          lVar8 = 0x32;
          goto LAB_00128d90;
        }
        break;
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x38:
        if ((iVar3 == -1) && (iVar11 != -1)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"invalid byte specificaton before quote in ",0x2a);
          pcVar9 = "decimal number";
          lVar8 = 0xe;
          goto LAB_00128d90;
        }
        if (iVar3 == -1) {
          iVar11 = bVar1 - 0x30;
          uVar6 = 0xffffffff;
        }
        break;
      default:
        if ((bVar1 != 0x55) && (bVar1 != 0x75)) goto switchD_00128bc0_caseD_28;
        if (iVar3 != -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar9 = "cannot have endian specified after quote";
          lVar8 = 0x28;
          goto LAB_00128d90;
        }
        if (iVar12 != -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar9 = "extra \"u\" in decimal number";
          lVar8 = 0x1b;
          goto LAB_00128d90;
        }
        uVar6 = 0xffffffff;
        iVar12 = iVar15;
      }
      uVar16 = uVar16 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar16);
    iVar3 = (int)uVar6;
    if (iVar3 != -1) {
      if (iVar3 != uVar4 - 1) {
        if ((iVar5 == -1) && (iVar11 == 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar9 = "only floating-point numbers can use 8 bytes";
          lVar8 = 0x2b;
          goto LAB_00128d90;
        }
        if (iVar5 != -1) {
          iVar5 = 4;
          if (iVar11 != -1) {
            iVar5 = iVar11;
          }
          value_01 = atof((word->_M_dataplus)._M_p + (long)iVar3 + 1);
          if (iVar5 == 8) {
            if (iVar12 != -1) {
              writeLittleEndianDouble(out,value_01);
              return 1;
            }
            writeBigEndianDouble(out,value_01);
            return 1;
          }
          if (iVar5 == 4) {
            if (iVar12 != -1) {
              writeLittleEndianFloat(out,(float)value_01);
              return 1;
            }
            writeBigEndianFloat(out,(float)value_01);
            return 1;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar9 = "floating-point numbers can be only 4 or 8 bytes";
          lVar8 = 0x2f;
LAB_00129767:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar8);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          return 0;
        }
        switch(iVar11) {
        default:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error on line ",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar9 = "invalid byte count specification for decimal number";
          lVar8 = 0x33;
          goto LAB_00129767;
        case 1:
          uVar4 = atoi((word->_M_dataplus)._M_p + (long)iVar3 + 1);
          if (iVar13 == -1) {
            pcVar9 = local_3a + 3;
          }
          else {
            pcVar9 = local_3a + 2;
          }
          break;
        case 2:
          iVar5 = atoi((word->_M_dataplus)._M_p + (long)iVar3 + 1);
          value = (ushort)iVar5;
          if (iVar13 == -1) {
            if (iVar12 != -1) {
              writeLittleEndianUShort(out,value);
              return 1;
            }
            writeBigEndianUShort(out,value);
            return 1;
          }
          if (iVar12 != -1) {
            writeLittleEndianShort(out,value);
            return 1;
          }
          writeBigEndianShort(out,value);
          return 1;
        case 3:
          if (iVar13 != -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error on line ",0xe);
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
            std::endl<char,std::char_traits<char>>(poVar7);
            pcVar9 = "negative decimal numbers cannot be stored in 3 bytes";
            lVar8 = 0x34;
            goto LAB_00129767;
          }
          iVar5 = atoi((word->_M_dataplus)._M_p + (long)iVar3 + 1);
          cVar14 = (char)((uint)iVar5 >> 8);
          cVar10 = (char)((uint)iVar5 >> 0x10);
          if (iVar12 == -1) {
            local_36 = cVar10;
            std::__ostream_insert<char,std::char_traits<char>>(out,&local_36,1);
            local_35 = cVar14;
            std::__ostream_insert<char,std::char_traits<char>>(out,&local_35,1);
            pcVar9 = &local_34;
            local_34 = (char)iVar5;
          }
          else {
            local_33 = (char)iVar5;
            std::__ostream_insert<char,std::char_traits<char>>(out,&local_33,1);
            local_32 = cVar14;
            std::__ostream_insert<char,std::char_traits<char>>(out,&local_32,1);
            pcVar9 = &local_31;
            local_31 = cVar10;
          }
          goto LAB_00129804;
        case 4:
          iVar5 = atoi((word->_M_dataplus)._M_p + (long)iVar3 + 1);
          value_00 = (ulong)iVar5;
          if (iVar13 == -1) {
            if (iVar12 == -1) {
              writeBigEndianULong(out,value_00);
            }
            else {
              writeLittleEndianULong(out,value_00);
            }
          }
          else if (iVar12 == -1) {
            writeBigEndianLong(out,value_00);
          }
          else {
            writeLittleEndianLong(out,value_00);
          }
          return 1;
        case -1:
          uVar4 = atoi((word->_M_dataplus)._M_p + (long)iVar3 + 1);
          if (iVar13 == -1) {
            if (0xff < uVar4) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Error on line ",0xe);
              poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
              std::endl<char,std::char_traits<char>>(poVar7);
              pcVar9 = "Decimal number out of range from 0 to 255";
              lVar8 = 0x29;
              goto LAB_00129767;
            }
            pcVar9 = local_3a + 1;
          }
          else {
            if ((int)(char)uVar4 != uVar4) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Error on line ",0xe);
              poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
              std::endl<char,std::char_traits<char>>(poVar7);
              pcVar9 = "Decimal number out of range from -128 to 127";
              lVar8 = 0x2c;
              goto LAB_00129767;
            }
            pcVar9 = local_3a;
          }
        }
        *pcVar9 = (char)uVar4;
LAB_00129804:
        std::__ostream_insert<char,std::char_traits<char>>(out,pcVar9,1);
        return 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pcVar9 = "there must be a decimal number after the quote";
      lVar8 = 0x2e;
      goto LAB_00128d90;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," at token: ",0xb);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(word->_M_dataplus)._M_p,word->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  pcVar9 = "there must be a quote to signify a decimal number";
  lVar8 = 0x31;
LAB_00128d90:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar8);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
  cVar10 = '(';
LAB_00128db2:
  std::ostream::put(cVar10);
  std::ostream::flush();
  return 0;
}

Assistant:

int Binasc::processDecimalWord(std::ostream& out, const std::string& word,
		int lineNum) {
	int length = (int)word.size();        // length of ascii binary number
	int byteCount = -1;              // number of bytes to output
	int quoteIndex = -1;             // index of decimal specifier
	int signIndex = -1;              // index of any sign for number
	int periodIndex = -1;            // index of period for floating point
	int endianIndex = -1;            // index of little endian specifier
	int i = 0;

	// make sure that all characters are valid
	for (i=0; i<length; i++) {
		switch (word[i]) {
			case '\'':
				if (quoteIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "extra quote in decimal number" << std::endl;
					return 0;
				} else {
					quoteIndex = i;
				}
				break;
			case '-':
				if (signIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "cannot have more than two minus signs in number"
						  << std::endl;
					return 0;
				} else {
					signIndex = i;
				}
				if (i == 0 || word[i-1] != '\'') {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "minus sign must immediately follow quote mark" << std::endl;
					return 0;
				}
				break;
			case '.':
				if (quoteIndex == -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "cannot have decimal marker before quote" << std::endl;
					return 0;
				}
				if (periodIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "extra period in decimal number" << std::endl;
					return 0;
				} else {
					periodIndex = i;
				}
				break;
			case 'u':
			case 'U':
				if (quoteIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "cannot have endian specified after quote" << std::endl;
					return 0;
				}
				if (endianIndex != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "extra \"u\" in decimal number" << std::endl;
					return 0;
				} else {
					endianIndex = i;
				}
				break;
			case '8':
			case '1': case '2': case '3': case '4':
				if (quoteIndex == -1 && byteCount != -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "invalid byte specificaton before quote in "
						  << "decimal number" << std::endl;
					return 0;
				} else if (quoteIndex == -1) {
					byteCount = word[i] - '0';
				}
				break;
			case '0': case '5': case '6': case '7': case '9':
				if (quoteIndex == -1) {
					std::cerr << "Error on line " << lineNum << " at token: " << word
						  << std::endl;
					std::cerr << "cannot have numbers before quote in decimal number"
						  << std::endl;
					return 0;
				}
				break;
			default:
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "Invalid character in decimal number"
						  " (character number " << i <<")" << std::endl;
				return 0;
		}
	}

	// there must be a quote character to indicate a decimal number
	// and there must be a decimal number after the quote
	if (quoteIndex == -1) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "there must be a quote to signify a decimal number" << std::endl;
		return 0;
	} else if (quoteIndex == length - 1) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "there must be a decimal number after the quote" << std::endl;
		return 0;
	}

	// 8 byte decimal output can only occur if reading a double number
	if (periodIndex == -1 && byteCount == 8) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "only floating-point numbers can use 8 bytes" << std::endl;
		return 0;
	}

	// default size for floating point numbers is 4 bytes
	if (periodIndex != -1) {
		if (byteCount == -1) {
			byteCount = 4;
		}
	}

	// process any floating point numbers possibilities
	if (periodIndex != -1) {
		double doubleOutput = atof(&word[quoteIndex+1]);
		float  floatOutput  = (float)doubleOutput;
		switch (byteCount) {
			case 4:
			  if (endianIndex == -1) {
				  writeBigEndianFloat(out, floatOutput);
			  } else {
				  writeLittleEndianFloat(out, floatOutput);
			  }
			  return 1;
			  break;
			case 8:
			  if (endianIndex == -1) {
				  writeBigEndianDouble(out, doubleOutput);
			  } else {
				  writeLittleEndianDouble(out, doubleOutput);
			  }
			  return 1;
			  break;
			default:
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "floating-point numbers can be only 4 or 8 bytes" << std::endl;
				return 0;
		}
	}

	// process any integer decimal number possibilities

	// default integer size is one byte, if size is not specified, then
	// the number must be in the one byte range and cannot overflow
	// the byte if the size of the decimal number is not specified
	if (byteCount == -1) {
		if (signIndex != -1) {
			long tempLong = atoi(&word[quoteIndex + 1]);
			if (tempLong > 127 || tempLong < -128) {
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "Decimal number out of range from -128 to 127" << std::endl;
				return 0;
			}
			char charOutput = (char)tempLong;
			out << charOutput;
			return 1;
		} else {
			ulong tempLong = (ulong)atoi(&word[quoteIndex + 1]);
			uchar ucharOutput = (uchar)tempLong;
			if (tempLong > 255) { // || (tempLong < 0)) {
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "Decimal number out of range from 0 to 255" << std::endl;
				return 0;
			}
			out << ucharOutput;
			return 1;
		}
	}

	// left with an integer number with a specified number of bytes
	switch (byteCount) {
		case 1:
			if (signIndex != -1) {
				long tempLong = atoi(&word[quoteIndex + 1]);
				char charOutput = (char)tempLong;
				out << charOutput;
				return 1;
			} else {
				ulong tempLong = (ulong)atoi(&word[quoteIndex + 1]);
				uchar ucharOutput = (uchar)tempLong;
				out << ucharOutput;
				return 1;
			}
			break;
		case 2:
			if (signIndex != -1) {
				long tempLong = atoi(&word[quoteIndex + 1]);
				short shortOutput = (short)tempLong;
				if (endianIndex == -1) {
					writeBigEndianShort(out, shortOutput);
				} else {
					writeLittleEndianShort(out, shortOutput);
				}
				return 1;
			} else {
				ulong tempLong = (ulong)atoi(&word[quoteIndex + 1]);
				ushort ushortOutput = (ushort)tempLong;
				if (endianIndex == -1) {
					writeBigEndianUShort(out, ushortOutput);
				} else {
					writeLittleEndianUShort(out, ushortOutput);
				}
				return 1;
			}
			break;
		case 3:
			{
			if (signIndex != -1) {
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "negative decimal numbers cannot be stored in 3 bytes"
					  << std::endl;
				return 0;
			}
			ulong tempLong = (ulong)atoi(&word[quoteIndex + 1]);
			uchar byte1 = (uchar)((tempLong & 0x00ff0000) >> 16);
			uchar byte2 = (uchar)((tempLong & 0x0000ff00) >> 8);
			uchar byte3 = (uchar)((tempLong & 0x000000ff));
			if (endianIndex == -1) {
				out << byte1;
				out << byte2;
				out << byte3;
			} else {
				out << byte3;
				out << byte2;
				out << byte1;
			}
			return 1;
			}
			break;
		case 4:
			if (signIndex != -1) {
				long tempLong = atoi(&word[quoteIndex + 1]);
				if (endianIndex == -1) {
					writeBigEndianLong(out, tempLong);
				} else {
					writeLittleEndianLong(out, tempLong);
				}
				return 1;
			} else {
				ulong tempuLong = (ulong)atoi(&word[quoteIndex + 1]);
				if (endianIndex == -1) {
					writeBigEndianULong(out, tempuLong);
				} else {
					writeLittleEndianULong(out, tempuLong);
				}
				return 1;
			}
			break;
		default:
			std::cerr << "Error on line " << lineNum << " at token: " << word
				  << std::endl;
			std::cerr << "invalid byte count specification for decimal number" << std::endl;
			return 0;
	}
}